

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgtool.c
# Opt level: O0

LispPTR get_fn_fvar_name(fnhead *fnobj,DLword offset)

{
  DLword *local_28;
  LispPTR *second_table;
  LispPTR *first_table;
  DLword offset_local;
  fnhead *fnobj_local;
  
  second_table = (LispPTR *)(&fnobj->na + (int)(uint)(*(ushort *)&fnobj->field_0xc & 0xff));
  for (local_28 = (DLword *)((long)second_table + (long)(int)(uint)fnobj->ntsize * 2);
      *(uint *)local_28 != (offset | 0xc0000000); local_28 = local_28 + 2) {
    second_table = second_table + 1;
  }
  return *second_table;
}

Assistant:

LispPTR get_fn_fvar_name(struct fnhead *fnobj, DLword offset) {
  NAMETABLE *first_table;
  NAMETABLE *second_table;

  first_table = (NAMETABLE *)((DLword *)fnobj + fnobj->fvaroffset);
  second_table = (NAMETABLE *)((DLword *)first_table + fnobj->ntsize);
#ifdef BIGATOMS
  while (*(second_table) != (VTY_FVAR | offset))
#else
  while (GETWORD(second_table) != (VTY_FVAR | offset))
#endif /* BIGATOMS */

  {
    first_table++;
    second_table++;
  }
#ifdef BIGATOMS
  return ((LispPTR) * (first_table));
#else
  return ((LispPTR)GETWORD(first_table));
#endif /* BIGATOMS */

}